

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdStarter.c
# Opt level: O1

void * Abc_RunThread(void *pCommand)

{
  int iVar1;
  
  iVar1 = system((char *)pCommand);
  if (iVar1 != 0) {
    fwrite("The following command has returned non-zero exit status:\n",0x39,1,_stderr);
    fprintf(_stderr,"\"%s\"\n\n",pCommand);
    fflush(_stdout);
  }
  free(pCommand);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
  if (iVar1 == 0) {
    nThreadsRunning = nThreadsRunning + -1;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    if (iVar1 == 0) {
      pthread_exit((void *)0x0);
    }
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cmd/cmdStarter.c"
                  ,0x57,"void *Abc_RunThread(void *)");
  }
  __assert_fail("status == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cmd/cmdStarter.c"
                ,0x55,"void *Abc_RunThread(void *)");
}

Assistant:

void * Abc_RunThread( void * pCommand )
{
    int status;
    // perform the call
    if ( system( (char *)pCommand ) )
    {
        fprintf( stderr, "The following command has returned non-zero exit status:\n" );
        fprintf( stderr, "\"%s\"\n\n", (char *)pCommand );
        fflush( stdout );
    }
    free( pCommand );

    // decrement the number of threads runining 
    status = pthread_mutex_lock(&mutex);   assert(status == 0);
    nThreadsRunning--;
    status = pthread_mutex_unlock(&mutex); assert(status == 0);

    // quit this thread
    //printf("...Finishing %s\n", (char *)Command);
    pthread_exit( NULL );
    assert(0);
    return NULL;
}